

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx_impl.c
# Opt level: O0

void * memory_allocator_nginx_reallocate
                 (memory_allocator_impl impl,void *data,size_t size,size_t new_size)

{
  ulong in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  void *new_data;
  memory_allocator_nginx_impl nginx_impl;
  void *local_8;
  
  local_8 = (void *)(*(code *)in_RDI[1])(*in_RDI,in_RCX);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    if (in_RDX < in_RCX) {
      (*(code *)in_RDI[2])(local_8,in_RSI,in_RDX);
    }
    else {
      (*(code *)in_RDI[2])(local_8,in_RSI,in_RCX);
    }
    (*(code *)in_RDI[3])(*in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

void *memory_allocator_nginx_reallocate(memory_allocator_impl impl, void *data, size_t size, size_t new_size)
{
	memory_allocator_nginx_impl nginx_impl = (memory_allocator_nginx_impl)impl;

	void *new_data = nginx_impl->palloc(nginx_impl->pool, new_size);

	if (new_data == NULL)
	{
		return NULL;
	}

	if (size < new_size)
	{
		nginx_impl->pcopy(new_data, data, size);
	}
	else
	{
		nginx_impl->pcopy(new_data, data, new_size);
	}

	(void)nginx_impl->pfree(nginx_impl->pool, data);

	return new_data;
}